

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O0

LY_ERR ylib_submodules(lyd_node *parent,lysp_module *pmod,ly_bool bis)

{
  char *pcVar1;
  LY_ERR LVar2;
  lysp_revision *local_88;
  lyd_node *local_70;
  LY_ERR ret___3;
  LY_ERR ret___2;
  LY_ERR ret___1;
  LY_ERR ret__;
  char *str;
  lysp_submodule *plStack_40;
  int r;
  lysp_submodule *submod;
  lyd_node *cont;
  uint64_t i;
  LY_ERR ret;
  ly_bool bis_local;
  lysp_module *pmod_local;
  lyd_node *parent_local;
  
  cont = (lyd_node *)0x0;
  i._7_1_ = bis;
  _ret = pmod;
  pmod_local = (lysp_module *)parent;
  do {
    if (_ret->includes == (lysp_include *)0x0) {
      local_70 = (lyd_node *)0x0;
    }
    else {
      local_70 = *(lyd_node **)(_ret->includes[-1].rev + 8);
    }
    if (local_70 <= cont) {
      return LY_SUCCESS;
    }
    plStack_40 = _ret->includes[(long)cont].submodule;
    if (i._7_1_ == '\0') {
      if (plStack_40->revs == (lysp_revision *)0x0) {
        local_88 = (lysp_revision *)0x254298;
      }
      else {
        local_88 = plStack_40->revs;
      }
      LVar2 = lyd_new_list((lyd_node *)pmod_local,(lys_module *)0x0,"submodule",0,
                           (lyd_node **)&submod,plStack_40->name,local_88);
joined_r0x0012703c:
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
    }
    else {
      LVar2 = lyd_new_list((lyd_node *)pmod_local,(lys_module *)0x0,"submodule",0,
                           (lyd_node **)&submod,plStack_40->name);
      if (LVar2 != LY_SUCCESS) {
        return LVar2;
      }
      if (plStack_40->revs != (lysp_revision *)0x0) {
        LVar2 = lyd_new_term((lyd_node *)submod,(lys_module *)0x0,"revision",plStack_40->revs->date,
                             0,(lyd_node **)0x0);
        goto joined_r0x0012703c;
      }
    }
    if (plStack_40->filepath != (char *)0x0) {
      str._4_4_ = asprintf((char **)&ret___1,"file://%s",plStack_40->filepath);
      if (str._4_4_ == -1) {
        ly_log(_ret->mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ylib_submodules")
        ;
        return LY_EMEM;
      }
      pcVar1 = "shared-schema";
      if (i._7_1_ != '\0') {
        pcVar1 = "ly_log_location";
      }
      i._0_4_ = lyd_new_term((lyd_node *)submod,(lys_module *)0x0,pcVar1 + 7,_ret___1,0,
                             (lyd_node **)0x0);
      free(_ret___1);
      if ((LY_ERR)i != LY_SUCCESS) {
        return (LY_ERR)i;
      }
    }
    cont = (lyd_node *)((long)&cont->hash + 1);
  } while( true );
}

Assistant:

static LY_ERR
ylib_submodules(struct lyd_node *parent, const struct lysp_module *pmod, ly_bool bis)
{
    LY_ERR ret;
    LY_ARRAY_COUNT_TYPE i;
    struct lyd_node *cont;
    struct lysp_submodule *submod;
    int r;
    char *str;

    LY_ARRAY_FOR(pmod->includes, i) {
        submod = pmod->includes[i].submodule;

        if (bis) {
            LY_CHECK_RET(lyd_new_list(parent, NULL, "submodule", 0, &cont, submod->name));

            if (submod->revs) {
                LY_CHECK_RET(lyd_new_term(cont, NULL, "revision", submod->revs[0].date, 0, NULL));
            }
        } else {
            LY_CHECK_RET(lyd_new_list(parent, NULL, "submodule", 0, &cont, submod->name,
                    (submod->revs ? submod->revs[0].date : "")));
        }

        if (submod->filepath) {
            r = asprintf(&str, "file://%s", submod->filepath);
            LY_CHECK_ERR_RET(r == -1, LOGMEM(pmod->mod->ctx), LY_EMEM);

            ret = lyd_new_term(cont, NULL, bis ? "location" : "schema", str, 0, NULL);
            free(str);
            LY_CHECK_RET(ret);
        }
    }

    return LY_SUCCESS;
}